

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileJsonArray(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pSVar1;
  SyToken *pSVar2;
  SyToken *pStart;
  sxi32 sVar3;
  int iP1;
  SyToken *pTmpIn;
  
  pGen->pIn = pGen->pIn + 1;
  pGen->pEnd = pGen->pEnd + -1;
  iP1 = 0;
  while( true ) {
    pStart = pGen->pIn;
    while ((pStart < pGen->pEnd && ((pStart->nType & 0x20000) != 0))) {
      pGen->pIn = pStart + 1;
      pStart = pStart + 1;
    }
    sVar3 = jx9GetNextExpr(pStart,pGen->pEnd,&pGen->pIn);
    if (sVar3 != 0) break;
    pSVar1 = pGen->pIn;
    pSVar2 = pGen->pEnd;
    pGen->pIn = pStart;
    pGen->pEnd = pSVar1;
    sVar3 = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    pGen->pIn = pSVar1;
    pGen->pEnd = pSVar2;
    if (sVar3 == -10) {
      return -10;
    }
    iP1 = iP1 + 1;
  }
  jx9VmEmitInstr(pGen->pVm,6,iP1,0,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileJsonArray(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	sxi32 nPair = 0;
	SyToken *pCur;
	sxi32 rc;

	pGen->pIn++; /* Jump the open square bracket '['*/
	pGen->pEnd--;
	SXUNUSED(iCompileFlag); /* cc warning */
	for(;;){
		/* Jump leading commas */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
		pCur = pGen->pIn;
		if( SXRET_OK != jx9GetNextExpr(pGen->pIn, pGen->pEnd, &pGen->pIn) ){
			/* No more entry to process */
			break;
		}
		/* Compile entry */
		rc = GenStateCompileJSONEntry(&(*pGen),pCur,pGen->pIn,EXPR_FLAG_RDONLY_LOAD/*Do not create the variable if inexistant*/,0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		nPair++;
	}
	/* Emit the load map instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD_MAP,nPair,0,0,0);
	/* Node successfully compiled */
	return SXRET_OK;
}